

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c
# Opt level: O0

LispPTR rpc(LispPTR *args)

{
  int __fd;
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  ulong uVar4;
  DLword *pDVar5;
  DLword *__buf;
  OneDArray *pOVar6;
  ssize_t sVar7;
  int *piVar8;
  LispPTR local_1f8;
  ulong local_1f0;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp;
  timeval time_waited;
  timeval total_timeout;
  timeval pertry_timeout;
  fd_set read_descriptors;
  uint fromlen;
  int dest;
  int port;
  int received;
  int out_length;
  int msec_between_tries;
  int msec_until_timeout;
  int s;
  char *destaddr;
  char *inbuf;
  char *outbuf;
  sockaddr_in from;
  sockaddr_in sin1;
  sockaddr_in sin;
  hostent *hp;
  char hostname [100];
  LispPTR *args_local;
  
  read_descriptors.__fds_bits[0xf]._4_4_ =
       *(ushort *)((ulong)(MDStypetbl + (*args >> 9)) ^ 2) & 0x7ff;
  if ((read_descriptors.__fds_bits[0xf]._4_4_ == 2) || (read_descriptors.__fds_bits[0xf]._4_4_ == 1)
     ) {
    if ((*args & 0xfff0000) == 0xe0000) {
      read_descriptors.__fds_bits[0xf]._4_4_ = *args & 0xffff;
    }
    else if ((*args & 0xfff0000) == 0xf0000) {
      read_descriptors.__fds_bits[0xf]._4_4_ = *args | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (*args >> 9)) ^ 2) & 0x7ff) != 2) {
        return 0;
      }
      pLVar3 = NativeAligned4FromLAddr(*args);
      read_descriptors.__fds_bits[0xf]._4_4_ = *pLVar3;
    }
    sin.sin_zero = (uchar  [8])gethostbyaddr((void *)((long)read_descriptors.__fds_bits + 0x7c),4,2)
    ;
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(*args);
    if ((int)pLVar3[2] < 100) {
      local_1f8 = pLVar3[2];
    }
    else {
      local_1f8 = 100;
    }
    uVar4 = (ulong)(int)local_1f8;
    if (*(char *)((long)pLVar3 + 6) == 'C') {
      pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
      lf_i = (size_t)&hp;
      lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar3[1]);
      for (lf_ii = 0; lf_ii < uVar4; lf_ii = lf_ii + 1) {
        *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
        lf_i = lf_i + 1;
        lf_dptr = lf_dptr + 1;
      }
      hostname[uVar4 - 8] = '\0';
    }
    else if (*(char *)((long)pLVar3 + 6) == 'D') {
      pDVar5 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
      lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar3[1]);
      lf_sbase = (short *)&hp;
      for (local_1f0 = 0; local_1f0 < uVar4; local_1f0 = local_1f0 + 1) {
        *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
        lf_length = lf_length + 2;
        lf_sbase = (short *)((long)lf_sbase + 1);
      }
      *(undefined1 *)lf_sbase = 0;
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    sin.sin_zero = (uchar  [8])gethostbyname((char *)&hp);
  }
  if ((args[1] & 0xfff0000) == 0xe0000) {
    fromlen._0_2_ = (uint16_t)args[1];
  }
  else if ((args[1] & 0xfff0000) == 0xf0000) {
    fromlen._0_2_ = (uint16_t)args[1];
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (args[1] >> 9)) ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar3 = NativeAligned4FromLAddr(args[1]);
    fromlen._0_2_ = (uint16_t)*pLVar3;
  }
  pDVar5 = NativeAligned2FromLAddr(args[2]);
  __buf = NativeAligned2FromLAddr(args[3]);
  if ((args[4] & 0xfff0000) == 0xe0000) {
    out_length = args[4] & 0xffff;
  }
  else if ((args[4] & 0xfff0000) == 0xf0000) {
    out_length = args[4] | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (args[4] >> 9)) ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar3 = NativeAligned4FromLAddr(args[4]);
    out_length = *pLVar3;
  }
  if ((args[5] & 0xfff0000) == 0xe0000) {
    received = args[5] & 0xffff;
  }
  else if ((args[5] & 0xfff0000) == 0xf0000) {
    received = args[5] | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (args[5] >> 9)) ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar3 = NativeAligned4FromLAddr(args[5]);
    received = *pLVar3;
  }
  if ((args[6] & 0xfff0000) == 0xe0000) {
    port = args[6] & 0xffff;
  }
  else if ((args[6] & 0xfff0000) == 0xf0000) {
    port = args[6] | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (args[6] >> 9)) ^ 2) & 0x7ff) != 2) {
      return 0;
    }
    pLVar3 = NativeAligned4FromLAddr(args[6]);
    port = *pLVar3;
  }
  pOVar6 = (OneDArray *)(long)((out_length * 1000) / 1000000);
  total_timeout.tv_sec = (__time_t)((out_length * 1000) % 1000000);
  total_timeout.tv_usec = (__suseconds_t)((received * 1000) / 1000000);
  pertry_timeout.tv_sec = (__time_t)((received * 1000) % 1000000);
  __fd = socket(2,2,0);
  if (-1 < __fd) {
    uVar1 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar1 | 0x800));
    memset(sin1.sin_zero,0,0x10);
    sin1.sin_zero[0] = '\x02';
    sin1.sin_zero[1] = '\0';
    bind(__fd,(sockaddr *)sin1.sin_zero,0x10);
    if (sin.sin_zero != (uchar  [8])0x0) {
      from.sin_zero._0_2_ = SUB42(*(undefined4 *)((long)sin.sin_zero + 0x10),0);
      memcpy(from.sin_zero + 4,(void *)**(undefined8 **)((long)sin.sin_zero + 0x18),
             (long)*(int *)((long)sin.sin_zero + 0x14));
      from.sin_zero._2_2_ = htons((uint16_t)fromlen);
      sVar7 = sendto(__fd,pDVar5,(long)port,0,(sockaddr *)from.sin_zero,0x10);
      if (sVar7 == port) {
        lf_arrayp = (OneDArray *)0x0;
        time_waited.tv_sec = 0;
        do {
          while( true ) {
            iVar2 = __fd;
            if (__fd < 0) {
              iVar2 = __fd + 0x3f;
            }
            read_descriptors.__fds_bits[(long)(iVar2 >> 6) + -1] =
                 read_descriptors.__fds_bits[(long)(iVar2 >> 6) + -1] |
                 1L << ((ulong)(byte)__fd & 0x3f);
            iVar2 = select(0x20,(fd_set *)&pertry_timeout.tv_usec,(fd_set *)0x0,(fd_set *)0x0,
                           (timeval *)&total_timeout.tv_usec);
            if (iVar2 == -1) break;
            if (iVar2 == 0) {
              lf_arrayp = (OneDArray *)(&lf_arrayp->field_0x0 + total_timeout.tv_usec);
              for (time_waited.tv_sec = pertry_timeout.tv_sec + time_waited.tv_sec;
                  999999 < time_waited.tv_sec; time_waited.tv_sec = time_waited.tv_sec + -1000000) {
                lf_arrayp = (OneDArray *)&lf_arrayp->field_0x1;
              }
              if ((long)pOVar6 < (long)lf_arrayp) {
                return 0;
              }
              if ((lf_arrayp == pOVar6) && (total_timeout.tv_sec <= time_waited.tv_sec)) {
                return 0;
              }
            }
            if ((read_descriptors.__fds_bits[(long)(__fd / 0x40) + -1] &
                1L << ((byte)((long)__fd % 0x40) & 0x3f)) != 0) {
              do {
                read_descriptors.__fds_bits[0xf]._0_4_ = 0x10;
                sVar7 = recvfrom(__fd,__buf,1000,0,(sockaddr *)&outbuf,
                                 (socklen_t *)(read_descriptors.__fds_bits + 0xf));
                if (-1 < (int)sVar7) {
                  close(__fd);
                  return 0x4c;
                }
                piVar8 = __errno_location();
              } while (*piVar8 == 4);
              if (*piVar8 != 0xb) {
                return 0;
              }
            }
          }
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
    }
  }
  return 0;
}

Assistant:

LispPTR rpc(LispPTR *args)
{
#ifndef DOS
  /* Arguments are:
     args[0]:Destination Address; hostname or internet address are both supported.
     args[1]:Remote port for this program.
     args[2]:Argument block pointer.
     args[3]:Result Block pointer.
     args[4]:Milliseconds before timeout
     args[5]:Milliseconds between tries
     args[6]:Argument block length
     */
  char hostname[MAX_HOSTNAME_LENGTH];
  struct hostent *hp;
  struct sockaddr_in sin, sin1, from;
  char *outbuf, *inbuf, *destaddr;
  int s, msec_until_timeout, msec_between_tries, out_length;
  int received;
  int port;
  int dest;
  unsigned fromlen;
  fd_set read_descriptors;
  struct timeval pertry_timeout, total_timeout, time_waited;

  /* Set timeout */
  /* CONVERT FROM LISP TO C TYPES */
  dest = GetTypeNumber(args[0]);

  if ((dest == TYPE_FIXP) || (dest == TYPE_SMALLP)) {
    N_GETNUMBER(args[0], dest, handle_error);
    destaddr = (char *)&dest;
    hp = gethostbyaddr(destaddr, sizeof(struct in_addr), AF_INET);
  } else {
    /* Convert Hostname */
    LispStringToCString(args[0], hostname, MAX_HOSTNAME_LENGTH);
    hp = gethostbyname(hostname);
  }

  N_GETNUMBER(args[1], port, handle_error);

  /* Translate the buffer pointer into C pointers */
  outbuf = (char *)(NativeAligned2FromLAddr(args[2]));
  inbuf = (char *)(NativeAligned2FromLAddr(args[3]));

  N_GETNUMBER(args[4], msec_until_timeout, handle_error);

  N_GETNUMBER(args[5], msec_between_tries, handle_error);

  N_GETNUMBER(args[6], out_length, handle_error);

  /* Convert to micro seconds */
  msec_until_timeout = msec_until_timeout * 1000;
  msec_between_tries = msec_between_tries * 1000;

  /* Set up the timeouts */
  total_timeout.tv_sec = msec_until_timeout / 1000000;
  total_timeout.tv_usec = msec_until_timeout % 1000000;
  pertry_timeout.tv_sec = msec_between_tries / 1000000;
  pertry_timeout.tv_usec = msec_between_tries % 1000000;

  /* SET UP THE SOCKET */

  /* Open the socket; Might want to make this non-blocking */
  if ((s = socket(AF_INET, SOCK_DGRAM, 0)) < 0) goto handle_error;

  /* The sockets that rpc controls don't block */
  fcntl(s, F_SETFL, fcntl(s, F_GETFL, 0) | O_NONBLOCK);

  memset((char *)&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  bind(s, (struct sockaddr *)&sin, sizeof(sin));

  /* Resolve the host address. */
  if (hp) {
    sin1.sin_family = hp->h_addrtype;
    memcpy(&sin1.sin_addr, hp->h_addr, hp->h_length);
  } else
    goto handle_error;

  /* Convert to network byte order */
  sin1.sin_port = htons((u_short)port);

  /* Send buffer out on the socket */
  if (sendto(s, outbuf, out_length, 0, (struct sockaddr *)&sin1, sizeof(sin1)) != out_length)
    goto handle_error;

  /* Set up the timers */
  time_waited.tv_sec = 0;
  time_waited.tv_usec = 0;

/* Start the waiting loop */
receive:

  /* Set the select mask */
  FD_SET(s, &read_descriptors);

  switch (
      select(32, &read_descriptors, NULL, NULL, &pertry_timeout)) {
    /* Per try timeout expired, Check the total timeout */
    case 0:
      time_waited.tv_sec += pertry_timeout.tv_sec;
      time_waited.tv_usec += pertry_timeout.tv_usec;
      while (time_waited.tv_usec >= 1000000) {
        time_waited.tv_sec++;
        time_waited.tv_usec -= 1000000;
      }
      /* If the time waited is greater than the total
       * timeout then there's an error
       */
      if ((time_waited.tv_sec > total_timeout.tv_sec) ||
          ((time_waited.tv_sec == total_timeout.tv_sec) &&
           (time_waited.tv_usec >= total_timeout.tv_usec)))
        goto handle_error;
      else
        break;

    /* An error was generated, Unless it was a system error stop */
    case -1:
      if (errno == EINTR)
        goto receive;
      else
        goto handle_error;
  }
  /* Nothing arrived for this socket, try again */
  if (!FD_ISSET(s, &read_descriptors)) goto receive;

/* Something arrived; try to get it */

getbuf:
  fromlen = sizeof(struct sockaddr);
  received = recvfrom(s, inbuf, UDP_DATA_BLOCK_SIZE, 0, (struct sockaddr *)&from, &fromlen);
  if (received < 0) switch (errno) {
      case EINTR: goto getbuf;
      case EWOULDBLOCK: goto receive;
      default: goto handle_error;
    }

  /* close the socket */
  close(s);

  /* Return TRUE */
  return (ATOM_T);

/* Return NIL; Eventually we will need to return something more informative, perhaps errno
 * would be sufficient.
 */
handle_error:
  return (NIL_PTR);
#endif /* DOS */
}